

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O1

void copy_suite::expand_copy_n(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  basic_iterator<int> first_end_00;
  view_pointer pcVar2;
  ulong uVar3;
  circular_view<int,_18446744073709551615UL> *pcVar4;
  ulong uVar5;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_begin_00;
  basic_iterator<int> __result;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> input;
  int array [4];
  allocator_type local_b9;
  vector<int,_std::allocator<int>_> local_b8;
  circular_view<int,_18446744073709551615UL> local_a0;
  vector<int,_std::allocator<int>_> local_80;
  undefined8 local_68;
  undefined8 uStack_60;
  circular_view<int,_18446744073709551615UL> *local_58;
  size_type sStack_50;
  circular_view<int,_18446744073709551615UL> *local_48;
  size_type sStack_40;
  type local_38 [4];
  
  local_a0.member.data = local_38;
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_a0.member.cap = 4;
  local_a0.member.size = 0;
  local_a0.member.next = 4;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x160000000b;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x2c00000021;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_80,__l,(allocator_type *)&local_68);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_a0,local_a0.member.cap);
  local_68 = 0;
  uStack_60 = 0;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_68;
  std::vector<int,_std::allocator<int>_>::vector(&local_b8,__l_00,&local_b9);
  uVar1 = local_a0.member.cap * 2;
  uVar3 = uVar1 - (local_a0.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar5 = uVar1 - 1 & local_a0.member.next - local_a0.member.size;
  }
  else {
    uVar5 = (local_a0.member.next - local_a0.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_40 = uVar1 - 1 & local_a0.member.next;
  }
  else {
    sStack_40 = local_a0.member.next % uVar1;
  }
  first_end.current = sStack_40;
  first_end.parent = &local_a0;
  first_begin.current = uVar5;
  first_begin.parent = &local_a0;
  pcVar4 = &local_a0;
  local_48 = &local_a0;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x4a,"void copy_suite::expand_copy_n()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  uVar1 = local_a0.member.cap * 2;
  if ((uVar1 & local_a0.member.cap * 2 - 1) == 0) {
    pcVar2 = (view_pointer)(uVar1 - 1 & local_a0.member.next - local_a0.member.size);
  }
  else {
    pcVar2 = (view_pointer)((local_a0.member.next - local_a0.member.size) % uVar1);
  }
  if (local_a0.member.size != 0) {
    __result.current = (size_type)pcVar4;
    __result.parent = pcVar2;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<int*,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
              ((__copy_move<false,false,std::random_access_iterator_tag> *)
               local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (int *)((long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + local_a0.member.size * 4),
               (int *)&local_a0,__result);
  }
  local_68 = 0x160000000b;
  uStack_60 = 0x2c00000021;
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)&local_68;
  std::vector<int,_std::allocator<int>_>::vector(&local_b8,__l_01,&local_b9);
  uVar1 = local_a0.member.cap * 2;
  uVar3 = uVar1 - (local_a0.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar5 = uVar1 - 1 & local_a0.member.next - local_a0.member.size;
  }
  else {
    uVar5 = (local_a0.member.next - local_a0.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_50 = uVar1 - 1 & local_a0.member.next;
  }
  else {
    sStack_50 = local_a0.member.next % uVar1;
  }
  first_end_00.current = sStack_50;
  first_end_00.parent = &local_a0;
  first_begin_00.current = uVar5;
  first_begin_00.parent = &local_a0;
  local_58 = &local_a0;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x50,"void copy_suite::expand_copy_n()",first_begin_00,first_end_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((__copy_move<false,false,std::random_access_iterator_tag> *)
      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (__copy_move<false,false,std::random_access_iterator_tag> *)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void expand_copy_n()
{
    int array[4] = {};
    circular_view<int> span(array);
    std::vector<int> input = { 11, 22, 33, 44, 55 };
    span.expand_back(span.capacity());
    {
        std::vector<int> expect = { 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    std::copy_n(input.begin(), span.size(), span.begin());
    {
        std::vector<int> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}